

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

void __thiscall icu_63::FCDUTF16CollationIterator::switchToBackward(FCDUTF16CollationIterator *this)

{
  UChar *pUVar1;
  FCDUTF16CollationIterator *this_local;
  
  if (this->checkDir < '\x01') {
    if ((this->super_UTF16CollationIterator).start != this->segmentStart) {
      pUVar1 = this->segmentStart;
      this->segmentLimit = pUVar1;
      (this->super_UTF16CollationIterator).limit = pUVar1;
      (this->super_UTF16CollationIterator).pos = pUVar1;
    }
    (this->super_UTF16CollationIterator).start = this->rawStart;
    this->checkDir = -1;
  }
  else {
    pUVar1 = (this->super_UTF16CollationIterator).pos;
    this->segmentLimit = pUVar1;
    (this->super_UTF16CollationIterator).limit = pUVar1;
    if ((this->super_UTF16CollationIterator).pos == this->segmentStart) {
      (this->super_UTF16CollationIterator).start = this->rawStart;
      this->checkDir = -1;
    }
    else {
      this->checkDir = '\0';
    }
  }
  return;
}

Assistant:

void
FCDUTF16CollationIterator::switchToBackward() {
    U_ASSERT(checkDir > 0 || (checkDir == 0 && pos == start));
    if(checkDir > 0) {
        // Turn around from forward checking.
        limit = segmentLimit = pos;
        if(pos == segmentStart) {
            start = rawStart;
            checkDir = -1;  // Check backward.
        } else {  // pos > segmentStart
            checkDir = 0;  // Stay in FCD segment.
        }
    } else {
        // Reached the start of the FCD segment.
        if(start == segmentStart) {
            // The input text segment is FCD, extend it backward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking backward from it.
            pos = limit = segmentLimit = segmentStart;
        }
        start = rawStart;
        checkDir = -1;
    }
}